

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_nwrite(Curl_easy *data,int sockindex,void *buf,size_t blen,ssize_t *pnwritten)

{
  uint in_EAX;
  ssize_t sVar1;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  sVar1 = (*data->conn->send[sockindex])(data,sockindex,buf,blen,(CURLcode *)((long)&uStack_18 + 4))
  ;
  if (uStack_18._4_4_ != CURLE_OK) {
    if (uStack_18._4_4_ == CURLE_AGAIN) {
      uStack_18._4_4_ = CURLE_OK;
      sVar1 = 0;
    }
    else {
      sVar1 = -1;
    }
  }
  *pnwritten = sVar1;
  return uStack_18._4_4_;
}

Assistant:

CURLcode Curl_nwrite(struct Curl_easy *data,
                     int sockindex,
                     const void *buf,
                     size_t blen,
                     ssize_t *pnwritten)
{
  ssize_t nwritten;
  CURLcode result = CURLE_OK;
  struct connectdata *conn;

  DEBUGASSERT(sockindex >= 0 && sockindex < 2);
  DEBUGASSERT(pnwritten);
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  conn = data->conn;
#ifdef CURLDEBUG
  {
    /* Allow debug builds to override this logic to force short sends
    */
    char *p = getenv("CURL_SMALLSENDS");
    if(p) {
      size_t altsize = (size_t)strtoul(p, NULL, 10);
      if(altsize)
        blen = CURLMIN(blen, altsize);
    }
  }
#endif
  nwritten = conn->send[sockindex](data, sockindex, buf, blen, &result);
  if(result == CURLE_AGAIN) {
    nwritten = 0;
    result = CURLE_OK;
  }
  else if(result) {
    nwritten = -1; /* make sure */
  }
  else {
    DEBUGASSERT(nwritten >= 0);
  }

  *pnwritten = nwritten;
  return result;
}